

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.hpp
# Opt level: O2

void __thiscall ClipperLib::PolyNode::~PolyNode(PolyNode *this)

{
  this->_vptr_PolyNode = (_func_int **)&PTR__PolyNode_0038c208;
  std::_Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::~_Vector_base
            (&(this->Childs).
              super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>);
  std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~_Vector_base
            (&(this->Contour).
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>);
  return;
}

Assistant:

virtual ~PolyNode(){}